

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiID IVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  float fVar7;
  float fVar8;
  ImS16 IVar9;
  ImS16 IVar10;
  ImGuiTabItemFlags IVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  ImGuiID IVar16;
  ImGuiTabItemFlags IVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar21;
  ulong uVar22;
  uint uVar23;
  ImGuiTabItem *pIVar24;
  ulong uVar25;
  bool bVar26;
  ImGuiTabItem item_tmp;
  undefined1 uStack_9;
  
  IVar2 = tab_bar->ReorderRequestTabId;
  if (IVar2 != 0) {
    uVar22 = (ulong)(tab_bar->Tabs).Size;
    bVar26 = 0 < (long)uVar22;
    if (0 < (long)uVar22) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar26 = true;
      if (in_RAX->ID != IVar2) {
        pIVar24 = in_RAX + (uVar22 - 1);
        pIVar21 = in_RAX;
        uVar20 = 1;
        do {
          uVar25 = uVar20;
          in_RAX = pIVar24;
          if (uVar22 == uVar25) break;
          in_RAX = pIVar21 + 1;
          pIVar1 = pIVar21 + 1;
          pIVar21 = in_RAX;
          uVar20 = uVar25 + 1;
        } while (pIVar1->ID != IVar2);
        bVar26 = uVar25 < uVar22;
      }
    }
    if (bVar26) goto LAB_00153b04;
  }
  in_RAX = (ImGuiTabItem *)0x0;
LAB_00153b04:
  if ((in_RAX != (ImGuiTabItem *)0x0) && ((in_RAX->Flags & 0x20U) == 0)) {
    pIVar21 = (tab_bar->Tabs).Data;
    uVar23 = (int)tab_bar->ReorderRequestDir +
             (int)((ulong)((long)in_RAX - (long)pIVar21) >> 2) * 0x38e38e39;
    if ((-1 < (int)uVar23) && ((int)uVar23 < (tab_bar->Tabs).Size)) {
      if (((pIVar21[uVar23].Flags & 0x20U) == 0) &&
         (((pIVar21[uVar23].Flags ^ in_RAX->Flags) & 0xc0U) == 0)) {
        pIVar21 = pIVar21 + uVar23;
        uVar3._0_2_ = in_RAX->IndexDuringLayout;
        uVar3._2_1_ = in_RAX->WantClose;
        uVar3._3_1_ = in_RAX->field_0x23;
        IVar16 = in_RAX->ID;
        IVar17 = in_RAX->Flags;
        iVar18 = in_RAX->LastFrameVisible;
        iVar19 = in_RAX->LastFrameSelected;
        fVar14 = in_RAX->Offset;
        fVar15 = in_RAX->Width;
        uVar4 = in_RAX->ContentWidth;
        uVar5 = in_RAX->NameOffset;
        uVar6 = in_RAX->BeginOrder;
        uStack_9 = (undefined1)((ushort)uVar6 >> 8);
        *(undefined4 *)((long)&in_RAX->BeginOrder + 1) =
             *(undefined4 *)((long)&pIVar21->BeginOrder + 1);
        IVar2 = pIVar21->ID;
        IVar11 = pIVar21->Flags;
        iVar12 = pIVar21->LastFrameVisible;
        iVar13 = pIVar21->LastFrameSelected;
        fVar7 = pIVar21->Width;
        fVar8 = pIVar21->ContentWidth;
        IVar9 = pIVar21->NameOffset;
        IVar10 = pIVar21->BeginOrder;
        in_RAX->Offset = pIVar21->Offset;
        in_RAX->Width = fVar7;
        in_RAX->ContentWidth = fVar8;
        in_RAX->NameOffset = IVar9;
        in_RAX->BeginOrder = IVar10;
        in_RAX->ID = IVar2;
        in_RAX->Flags = IVar11;
        in_RAX->LastFrameVisible = iVar12;
        in_RAX->LastFrameSelected = iVar13;
        *(uint *)((long)&pIVar21->BeginOrder + 1) = CONCAT31((int3)uVar3,uStack_9);
        pIVar21->Offset = fVar14;
        pIVar21->Width = fVar15;
        pIVar21->ContentWidth = (float)uVar4;
        pIVar21->NameOffset = uVar5;
        pIVar21->BeginOrder = uVar6;
        pIVar21->ID = IVar16;
        pIVar21->Flags = IVar17;
        pIVar21->LastFrameVisible = iVar18;
        pIVar21->LastFrameSelected = iVar19;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}